

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O0

expression * dup_expression(dmr_C *C,expression *expr)

{
  expression *__dest;
  expression *dup;
  expression *expr_local;
  dmr_C *C_local;
  
  __dest = dmrC_alloc_expression(C,expr->pos,(uint)(*(ushort *)expr & 0xff));
  memcpy(__dest,expr,0x40);
  return __dest;
}

Assistant:

static struct expression * dup_expression(struct dmr_C *C, struct expression *expr)
{
	struct expression *dup = dmrC_alloc_expression(C, expr->pos, expr->type);
	*dup = *expr;
	return dup;
}